

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall
H264StreamReader::writeSEIMessage
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,SEIUnit *sei,
          uint8_t payloadType)

{
  bool bVar1;
  int iVar2;
  VodCoreException *pVVar3;
  pointer ppVar4;
  string local_4e8;
  ostringstream local_4c8 [8];
  ostringstream ss_1;
  int sRez;
  uint msgLen;
  SPSUnit *local_340;
  SPSUnit *sps;
  uchar *i;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  uint8_t *puStack_310;
  uint beforeMessageLen;
  uint8_t *sizeField;
  BitStreamWriter writer;
  uint8_t tmpBuffer [256];
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  uint8_t *local_38;
  uint8_t *curPos;
  uint8_t payloadType_local;
  SEIUnit *sei_local;
  uint8_t *dstEnd_local;
  uint8_t *dstBuffer_local;
  H264StreamReader *this_local;
  
  if ((long)dstEnd - (long)dstBuffer < 4) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,"H264 stream error: Not enough buffer for write headers");
    tmpBuffer[0xff] = '\x01';
    pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar3,3,&local_1e0);
    tmpBuffer[0xff] = '\0';
    __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)&sizeField);
  local_38 = writeNalPrefix(this,dstBuffer);
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)&sizeField,(uint8_t *)&writer.m_curVal,tmpBuffer + 0xf8);
  puStack_310 = (uint8_t *)0x0;
  __range3._4_4_ = 0;
  if ((this->m_mvcSubStream & 1U) == 0) {
    BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,6);
    BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,(uint)payloadType);
  }
  else {
    BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,6);
    BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,0x25);
    puStack_310 = BitStream::getBuffer((BitStream *)&sizeField);
    iVar2 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sizeField);
    puStack_310 = puStack_310 + iVar2 / 8;
    BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,0);
    __range3._4_4_ = BitStreamWriter::getBitsCount((BitStreamWriter *)&sizeField);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->m_lastSeiMvcHeader);
    if (bVar1) {
      BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,0xc0);
      BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,0x10);
    }
    else {
      __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         (&this->m_lastSeiMvcHeader);
      i = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                             (&this->m_lastSeiMvcHeader);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&i), bVar1) {
        sps = (SPSUnit *)
              __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator*(&__end3);
        BitStreamWriter::putBits
                  ((BitStreamWriter *)&sizeField,8,
                   (uint)*(byte *)&(sps->super_NALUnit)._vptr_NALUnit);
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end3);
      }
    }
    BitStreamWriter::putBits((BitStreamWriter *)&sizeField,8,(uint)payloadType);
  }
  _sRez = std::
          map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
          ::find(&this->m_spsMap,&this->m_lastSliceSPS);
  ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator->
                     ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_> *)&sRez);
  local_340 = ppVar4->second;
  if (local_340 != (SPSUnit *)0x0) {
    if (payloadType == '\0') {
      SEIUnit::serialize_buffering_period_message(sei,local_340,(BitStreamWriter *)&sizeField,false)
      ;
    }
    else {
      SEIUnit::serialize_pic_timing_message(sei,local_340,(BitStreamWriter *)&sizeField,false);
    }
    if (puStack_310 != (uint8_t *)0x0) {
      iVar2 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sizeField);
      *puStack_310 = (uint8_t)((uint)(iVar2 - __range3._4_4_) >> 3);
    }
    NALUnit::write_rbsp_trailing_bits((BitStreamWriter *)&sizeField);
    BitStreamWriter::flushBits((BitStreamWriter *)&sizeField);
    iVar2 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sizeField);
    iVar2 = NALUnit::encodeNAL((uint8_t *)&writer.m_curVal,tmpBuffer + (long)(iVar2 / 8) + -8,
                               local_38,(long)dstEnd - (long)local_38);
    if (iVar2 == -1) {
      std::__cxx11::ostringstream::ostringstream(local_4c8);
      std::operator<<((ostream *)local_4c8,"H264 stream error: Not enough buffer for write headers")
      ;
      pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar3,3,&local_4e8);
      __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    local_38 = local_38 + iVar2;
  }
  return (int)local_38 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeSEIMessage(uint8_t *dstBuffer, const uint8_t *dstEnd, const SEIUnit &sei,
                                      const uint8_t payloadType) const
{
    uint8_t *curPos = dstBuffer;

    if (dstEnd - curPos < 4)
        THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")

    uint8_t tmpBuffer[256];
    BitStreamWriter writer{};
    curPos = writeNalPrefix(curPos);
    writer.setBuffer(tmpBuffer, tmpBuffer + sizeof(tmpBuffer));

    uint8_t *sizeField = nullptr;
    unsigned beforeMessageLen = 0;
    if (m_mvcSubStream)
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, SEI_MSG_MVC_SCALABLE_NESTING);

        sizeField = writer.getBuffer() + writer.getBitsCount() / 8;
        writer.putBits(8, 0);  // skip size field
        beforeMessageLen = writer.getBitsCount();

        static constexpr uint8_t DEFAULT_MVC_SEI_HEADER[] = {192, 16};
        if (!m_lastSeiMvcHeader.empty())
        {
            for (const auto &i : m_lastSeiMvcHeader) writer.putBits(8, i);
        }
        else
        {
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[0]);
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[1]);
        }

        writer.putBits(8, payloadType);
    }
    else
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, payloadType);
    }

    const SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
    if (sps)
    {
        if (payloadType == 0)
            sei.serialize_buffering_period_message(*sps, writer, false);

        else
            sei.serialize_pic_timing_message(*sps, writer, false);

        if (sizeField)
        {
            const unsigned msgLen = writer.getBitsCount() - beforeMessageLen;
            *sizeField = static_cast<uint8_t>(msgLen / 8);
        }
        SEIUnit::write_rbsp_trailing_bits(writer);
        writer.flushBits();

        const int sRez = SEIUnit::encodeNAL(tmpBuffer, tmpBuffer + writer.getBitsCount() / 8, curPos, dstEnd - curPos);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;
    }

    return static_cast<int>(curPos - dstBuffer);
}